

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_model_based_conversion.cc
# Opt level: O0

void __thiscall
sptk::GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion
          (GaussianMixtureModelBasedConversion *this,int num_source_order,int num_target_order,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,bool use_magic_number,double magic_number)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  SymmetricMatrix *inverse_matrix;
  const_reference pvVar5;
  const_reference this_00;
  double *pdVar6;
  const_reference pvVar7;
  reference this_01;
  reference pvVar8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_R9;
  undefined8 in_XMM0_Qa;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_stack_00000008;
  byte in_stack_00000010;
  int n_1;
  double tmp_1;
  int mm;
  int m_3;
  int ll_2;
  int l_3;
  int m_2;
  double tmp;
  int ll_1;
  int l_2;
  int n;
  int m_1;
  int ll;
  int l_1;
  SymmetricMatrix xx;
  int m;
  int l;
  int total_length;
  int k;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbd8;
  Matrix *in_stack_fffffffffffffbe0;
  SymmetricMatrix *in_stack_fffffffffffffbe8;
  value_type *in_stack_fffffffffffffbf0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffbf8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffc00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffc08;
  double *in_stack_fffffffffffffc18;
  SymmetricMatrix *in_stack_fffffffffffffc20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc28;
  Matrix *in_stack_fffffffffffffc30;
  double in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  undefined1 use_magic_number_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  int num_order;
  NonrecursiveMaximumLikelihoodParameterGeneration *in_stack_fffffffffffffca0;
  SymmetricMatrix *this_02;
  Row local_2d0;
  Row local_2b8;
  Row local_2a0;
  int local_284;
  double local_280;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  double local_260;
  int local_258;
  int local_254;
  Row local_250;
  Row local_238;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  Row local_1c8;
  Row local_1b0;
  int local_198;
  int local_194;
  double *local_190;
  double *local_188;
  double *local_180;
  double *local_178;
  double *local_170;
  int local_164;
  int local_160;
  undefined1 local_61 [73];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_18;
  
  num_order = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  use_magic_number_00 = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38);
  local_61[0x38] = in_stack_00000010 & 1;
  *in_RDI = &PTR__GaussianMixtureModelBasedConversion_00147990;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  iVar3 = *(int *)(in_RDI + 1);
  local_61._41_8_ = in_XMM0_Qa;
  local_61._57_8_ = in_R9;
  local_18 = in_RCX;
  sVar4 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(in_RCX);
  *(int *)(in_RDI + 2) = (iVar3 + 1) * ((int)sVar4 + 1);
  iVar3 = *(int *)((long)in_RDI + 0xc);
  sVar4 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(local_18);
  *(int *)((long)in_RDI + 0x14) = (iVar3 + 1) * ((int)sVar4 + 1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc30,
             in_stack_fffffffffffffc28);
  *(byte *)(in_RDI + 6) = local_61[0x38] & 1;
  in_RDI[7] = local_61._41_8_;
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 3));
  *(int *)(in_RDI + 8) = (int)sVar4;
  NonrecursiveMaximumLikelihoodParameterGeneration::NonrecursiveMaximumLikelihoodParameterGeneration
            (in_stack_fffffffffffffca0,num_order,in_stack_fffffffffffffc90,(bool)use_magic_number_00
             ,in_stack_fffffffffffffc80);
  *(undefined1 *)(in_RDI + 0x11) = 1;
  inverse_matrix = (SymmetricMatrix *)(long)*(int *)(in_RDI + 2);
  this_02 = (SymmetricMatrix *)local_61;
  std::allocator<double>::allocator((allocator<double> *)0x10b69c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc00._M_current,
             (size_type)in_stack_fffffffffffffbf8._M_current,
             (allocator_type *)in_stack_fffffffffffffbf0);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10b6d0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffc00._M_current,(size_type)in_stack_fffffffffffffbf8._M_current,
           (value_type *)in_stack_fffffffffffffbf0,(allocator_type *)in_stack_fffffffffffffbe8);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10b704);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
  std::allocator<double>::~allocator((allocator<double> *)0x10b71e);
  SymmetricMatrix::SymmetricMatrix
            (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
  std::allocator<sptk::SymmetricMatrix>::allocator((allocator<sptk::SymmetricMatrix> *)0x10b76b);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
             in_stack_fffffffffffffc00._M_current,(size_type)in_stack_fffffffffffffbf8._M_current,
             (value_type *)in_stack_fffffffffffffbf0,(allocator_type *)in_stack_fffffffffffffbe8);
  std::allocator<sptk::SymmetricMatrix>::~allocator((allocator<sptk::SymmetricMatrix> *)0x10b79f);
  SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffbe0);
  Matrix::Matrix(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                 (int)in_stack_fffffffffffffc28);
  std::allocator<sptk::Matrix>::allocator((allocator<sptk::Matrix> *)0x10b7fc);
  std::vector<sptk::Matrix,_std::allocator<sptk::Matrix>_>::vector
            ((vector<sptk::Matrix,_std::allocator<sptk::Matrix>_> *)
             in_stack_fffffffffffffc00._M_current,(size_type)in_stack_fffffffffffffbf8._M_current,
             in_stack_fffffffffffffbf0,(allocator_type *)in_stack_fffffffffffffbe8);
  std::allocator<sptk::Matrix>::~allocator((allocator<sptk::Matrix> *)0x10b830);
  Matrix::~Matrix(in_stack_fffffffffffffbe0);
  std::allocator<double>::allocator((allocator<double> *)0x10b884);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc00._M_current,
             (size_type)in_stack_fffffffffffffbf8._M_current,
             (allocator_type *)in_stack_fffffffffffffbf0);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10b8b8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffc00._M_current,(size_type)in_stack_fffffffffffffbf8._M_current,
           (value_type *)in_stack_fffffffffffffbf0,(allocator_type *)in_stack_fffffffffffffbe8);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10b8ec);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
  std::allocator<double>::~allocator((allocator<double> *)0x10b906);
  SymmetricMatrix::SymmetricMatrix
            (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
  std::allocator<sptk::SymmetricMatrix>::allocator((allocator<sptk::SymmetricMatrix> *)0x10b953);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
             in_stack_fffffffffffffc00._M_current,(size_type)in_stack_fffffffffffffbf8._M_current,
             (value_type *)in_stack_fffffffffffffbf0,(allocator_type *)in_stack_fffffffffffffbe8);
  std::allocator<sptk::SymmetricMatrix>::~allocator((allocator<sptk::SymmetricMatrix> *)0x10b987);
  SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffbe0);
  if ((((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) < 0)) ||
      (*(int *)(in_RDI + 8) < 1)) ||
     (bVar2 = NonrecursiveMaximumLikelihoodParameterGeneration::IsValid
                        ((NonrecursiveMaximumLikelihoodParameterGeneration *)(in_RDI + 9)), !bVar2))
  {
    *(undefined1 *)(in_RDI + 0x11) = 0;
  }
  else {
    for (local_160 = 0; local_160 < *(int *)(in_RDI + 8); local_160 = local_160 + 1) {
      local_164 = *(int *)(in_RDI + 2) + *(int *)((long)in_RDI + 0x14);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_61._57_8_,(long)local_160);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
      if (sVar4 != (long)local_164) {
LAB_0010bc57:
        *(undefined1 *)(in_RDI + 0x11) = 0;
        return;
      }
      this_00 = std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                operator[](in_stack_00000008,(long)local_160);
      iVar3 = SymmetricMatrix::GetNumDimension(this_00);
      if (iVar3 != local_164) goto LAB_0010bc57;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_61._57_8_,(long)local_160);
      local_170 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffbd8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_61._57_8_,(long)local_160);
      local_180 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffbd8);
      local_178 = (double *)
                  __gnu_cxx::
                  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffbe8,(difference_type)in_stack_fffffffffffffbe0)
      ;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x12),(long)local_160);
      local_188 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffbd8);
      local_190 = (double *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                             in_stack_fffffffffffffbf8);
      for (local_194 = 0; local_194 < *(int *)(in_RDI + 2); local_194 = local_194 + 1) {
        for (local_198 = 0; local_198 <= local_194; local_198 = local_198 + 1) {
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                    (in_stack_00000008,(long)local_160);
          SymmetricMatrix::operator[]
                    (in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          pdVar6 = SymmetricMatrix::Row::operator[]
                             ((Row *)in_stack_fffffffffffffbe0,
                              (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
          dVar1 = *pdVar6;
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                    ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                     (in_RDI + 0x15),(long)local_160);
          SymmetricMatrix::operator[]
                    (in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          pdVar6 = SymmetricMatrix::Row::operator[]
                             ((Row *)in_stack_fffffffffffffbe0,
                              (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
          *pdVar6 = dVar1;
          SymmetricMatrix::Row::~Row(&local_1c8);
          SymmetricMatrix::Row::~Row(&local_1b0);
        }
      }
      SymmetricMatrix::SymmetricMatrix
                (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                 (in_RDI + 0x15),(long)local_160);
      bVar2 = SymmetricMatrix::Invert(this_02,inverse_matrix);
      if (bVar2) {
        for (local_210 = 0; local_210 < *(int *)((long)in_RDI + 0x14); local_210 = local_210 + 1) {
          local_214 = *(int *)(in_RDI + 2) + local_210;
          for (local_218 = 0; local_218 < *(int *)(in_RDI + 2); local_218 = local_218 + 1) {
            for (local_21c = 0; local_21c < *(int *)(in_RDI + 2); local_21c = local_21c + 1) {
              std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                        (in_stack_00000008,(long)local_160);
              SymmetricMatrix::operator[]
                        (in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
              pdVar6 = SymmetricMatrix::Row::operator[]
                                 ((Row *)in_stack_fffffffffffffbe0,
                                  (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
              dVar1 = *pdVar6;
              SymmetricMatrix::operator[]
                        (in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
              pdVar6 = SymmetricMatrix::Row::operator[]
                                 ((Row *)in_stack_fffffffffffffbe0,
                                  (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
              in_stack_fffffffffffffc20 = (SymmetricMatrix *)*pdVar6;
              std::vector<sptk::Matrix,_std::allocator<sptk::Matrix>_>::operator[]
                        ((vector<sptk::Matrix,_std::allocator<sptk::Matrix>_> *)(in_RDI + 0x18),
                         (long)local_160);
              pdVar6 = Matrix::operator[](in_stack_fffffffffffffbe0,
                                          (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
              pdVar6[local_218] = dVar1 * (double)in_stack_fffffffffffffc20 + pdVar6[local_218];
              SymmetricMatrix::Row::~Row(&local_250);
              SymmetricMatrix::Row::~Row(&local_238);
            }
          }
        }
        for (local_254 = 0; local_254 < *(int *)((long)in_RDI + 0x14); local_254 = local_254 + 1) {
          local_258 = local_254 + *(int *)(in_RDI + 2);
          local_260 = 0.0;
          for (local_264 = 0; local_264 < *(int *)(in_RDI + 2); local_264 = local_264 + 1) {
            std::vector<sptk::Matrix,_std::allocator<sptk::Matrix>_>::operator[]
                      ((vector<sptk::Matrix,_std::allocator<sptk::Matrix>_> *)(in_RDI + 0x18),
                       (long)local_160);
            in_stack_fffffffffffffc18 =
                 Matrix::operator[](in_stack_fffffffffffffbe0,
                                    (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
            dVar1 = in_stack_fffffffffffffc18[local_264];
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)local_61._57_8_,(long)local_160);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar5,(long)local_264);
            local_260 = dVar1 * *pvVar7 + local_260;
          }
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_61._57_8_,(long)local_160);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_258);
          in_stack_fffffffffffffc08._M_current = (double *)(*pvVar7 - local_260);
          this_01 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)(in_RDI + 0x1b),(long)local_160);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_254)
          ;
          *pvVar8 = (value_type)in_stack_fffffffffffffc08._M_current;
        }
        for (local_268 = 0; local_268 < *(int *)((long)in_RDI + 0x14); local_268 = local_268 + 1) {
          local_26c = *(int *)(in_RDI + 2) + local_268;
          for (local_270 = 0; local_270 <= local_268; local_270 = local_270 + 1) {
            local_274 = *(int *)(in_RDI + 2) + local_270;
            local_280 = 0.0;
            for (local_284 = 0; iVar3 = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                local_284 < *(int *)(in_RDI + 2); local_284 = local_284 + 1) {
              std::vector<sptk::Matrix,_std::allocator<sptk::Matrix>_>::operator[]
                        ((vector<sptk::Matrix,_std::allocator<sptk::Matrix>_> *)(in_RDI + 0x18),
                         (long)local_160);
              in_stack_fffffffffffffc00._M_current =
                   Matrix::operator[](in_stack_fffffffffffffbe0,
                                      (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
              in_stack_fffffffffffffbf8._M_current =
                   (&(((vector<double,_std::allocator<double>_> *)
                      in_stack_fffffffffffffc00._M_current)->
                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start)[local_284];
              std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                        (in_stack_00000008,(long)local_160);
              SymmetricMatrix::operator[]
                        (in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
              pdVar6 = SymmetricMatrix::Row::operator[]
                                 ((Row *)in_stack_fffffffffffffbe0,
                                  (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
              local_280 = (double)in_stack_fffffffffffffbf8._M_current * *pdVar6 + local_280;
              SymmetricMatrix::Row::~Row(&local_2a0);
            }
            std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                      (in_stack_00000008,(long)local_160);
            SymmetricMatrix::operator[]
                      (in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
            in_stack_fffffffffffffbe8 =
                 (SymmetricMatrix *)
                 SymmetricMatrix::Row::operator[]((Row *)in_stack_fffffffffffffbe0,iVar3);
            in_stack_fffffffffffffbe0 =
                 (Matrix *)((double)in_stack_fffffffffffffbe8->_vptr_SymmetricMatrix - local_280);
            std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                      ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                       (in_RDI + 0x1e),(long)local_160);
            SymmetricMatrix::operator[]
                      (in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
            in_stack_fffffffffffffbd8 =
                 (vector<double,_std::allocator<double>_> *)
                 SymmetricMatrix::Row::operator[]((Row *)in_stack_fffffffffffffbe0,iVar3);
            (in_stack_fffffffffffffbd8->super__Vector_base<double,_std::allocator<double>_>)._M_impl
            .super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffbe0;
            SymmetricMatrix::Row::~Row(&local_2d0);
            SymmetricMatrix::Row::~Row(&local_2b8);
          }
        }
        local_20c = 0;
      }
      else {
        *(undefined1 *)(in_RDI + 0x11) = 0;
        local_20c = 1;
      }
      SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_fffffffffffffbe0);
      if (local_20c != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion(
    int num_source_order, int num_target_order,
    const std::vector<std::vector<double> >& window_coefficients,
    const std::vector<double>& weights,
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    bool use_magic_number, double magic_number)
    : num_source_order_(num_source_order),
      num_target_order_(num_target_order),
      source_length_((num_source_order_ + 1) *
                     (static_cast<int>(window_coefficients.size() + 1))),
      target_length_((num_target_order_ + 1) *
                     (static_cast<int>(window_coefficients.size() + 1))),
      weights_(weights),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      num_mixture_(static_cast<int>(weights_.size())),
      mlpg_(num_target_order_, window_coefficients, use_magic_number_,
            magic_number_),
      is_valid_(true),
      source_mean_vectors_(num_mixture_, std::vector<double>(source_length_)),
      source_covariance_matrices_(num_mixture_,
                                  SymmetricMatrix(source_length_)),
      e_slope_(num_mixture_, Matrix(target_length_, source_length_)),
      e_bias_(num_mixture_, std::vector<double>(target_length_)),
      d_(num_mixture_, SymmetricMatrix(target_length_)) {
  if (num_source_order_ < 0 || num_target_order_ < 0 || num_mixture_ <= 0 ||
      !mlpg_.IsValid()) {
    is_valid_ = false;
    return;
  }

  for (int k(0); k < num_mixture_; ++k) {
    // Check size of mean vectors and covariance matrices.
    const int total_length(source_length_ + target_length_);
    if (mean_vectors[k].size() != static_cast<std::size_t>(total_length) ||
        covariance_matrices[k].GetNumDimension() != total_length) {
      is_valid_ = false;
      return;
    }

    // Set \mu^{(X)}.
    std::copy(mean_vectors[k].begin(), mean_vectors[k].begin() + source_length_,
              source_mean_vectors_[k].begin());

    // Set \Sigma^{(XX)}.
    for (int l(0); l < source_length_; ++l) {
      for (int m(0); m <= l; ++m) {
        source_covariance_matrices_[k][l][m] = covariance_matrices[k][l][m];
      }
    }

    // Set \Sigma^{(YX)} \Sigma^{(XX)}^{-1}.
    SymmetricMatrix xx(source_length_);
    if (!source_covariance_matrices_[k].Invert(&xx)) {
      is_valid_ = false;
      return;
    }
    for (int l(0); l < target_length_; ++l) {
      const int ll(source_length_ + l);
      for (int m(0); m < source_length_; ++m) {
        for (int n(0); n < source_length_; ++n) {
          e_slope_[k][l][m] += covariance_matrices[k][ll][n] * xx[n][m];
        }
      }
    }

    // Set \mu^{(Y)} - \Sigma^{(YX)} \Sigma^{(XX)}^{-1} \mu^{(X)}
    for (int l(0); l < target_length_; ++l) {
      const int ll(l + source_length_);
      double tmp(0.0);
      for (int m(0); m < source_length_; ++m) {
        tmp += e_slope_[k][l][m] * mean_vectors[k][m];
      }
      e_bias_[k][l] = mean_vectors[k][ll] - tmp;
    }

    // Set D^{(Y)}.
    for (int l(0); l < target_length_; ++l) {
      const int ll(source_length_ + l);
      for (int m(0); m <= l; ++m) {
        const int mm(source_length_ + m);
        double tmp(0.0);
        for (int n(0); n < source_length_; ++n) {
          tmp += e_slope_[k][l][n] * covariance_matrices[k][n][mm];
        }
        d_[k][l][m] = covariance_matrices[k][ll][mm] - tmp;
      }
    }
  }
}